

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quest.c
# Opt level: O1

void chat_with_leader(void)

{
  boolean bVar1;
  uint uVar2;
  obj **otmp;
  int iVar3;
  
  if (((u.uhave._0_1_ & 0x10) != 0) && (((uint)quest_status._0_4_ >> 0xd & 1) == 0)) {
    quest_status._0_4_ = quest_status._0_4_ | 0x10000;
  }
  if (((uint)quest_status._0_4_ >> 0x13 & 1) != 0) {
    if ((u.uhave._0_1_ & 1) == 0) {
      iVar3 = 0x5a;
LAB_00229951:
      qt_pager(iVar3);
      return;
    }
    otmp = (obj **)0x0;
LAB_0022997f:
    finish_quest((obj *)otmp);
    return;
  }
  if ((u.uhave._0_1_ & 0x10) != 0) {
    otmp = &invent;
    do {
      otmp = &((obj *)otmp)->nobj->nobj;
      if ((obj *)otmp == (obj *)0x0) break;
      bVar1 = is_quest_artifact((obj *)otmp);
    } while (bVar1 == '\0');
    goto LAB_0022997f;
  }
  if ((quest_status._0_4_ & 0x60) == 0x40) {
    uVar2 = mt_random();
    iVar3 = uVar2 % 10 + 0x19;
    goto LAB_00229951;
  }
  if ((quest_status._0_4_ & 2) == 0) {
    qt_pager(0xf);
    quest_status._0_4_ = quest_status._0_4_ & 0xffffffe1 | 2;
  }
  else if ((quest_status._0_4_ & 0x20) == 0) {
    qt_pager(0x10);
  }
  else {
    verbalize("Your bones shall serve to warn others.");
  }
  bVar1 = on_level(&u.uz,&dungeon_topology.d_qstart_level);
  if (bVar1 == '\0') {
    return;
  }
  if (u.ulevel < 10) {
    qt_pager(0x13);
  }
  else {
    iVar3 = is_pure('\x01');
    if (iVar3 < 0) {
      if ((quest_status._0_4_ & 0x20) != 0) {
        return;
      }
      bVar1 = '<';
      com_pager(0x3c);
      quest_status._0_4_ = quest_status._0_4_ | 0x20;
      goto LAB_00229a50;
    }
    iVar3 = is_pure('\x01');
    if (iVar3 != 0) {
      qt_pager(0x15);
      exercise(2,'\x01');
      quest_status._0_4_ = quest_status._0_4_ | 0x40;
      historic_event('\0',"embarked upon an epic quest.");
      return;
    }
    qt_pager(0x14);
    quest_status._0_4_ = quest_status._0_4_ & 0xffffffe3 | 4;
  }
  bVar1 = '\x02';
  exercise(2,'\x01');
LAB_00229a50:
  expulsion(bVar1);
  return;
}

Assistant:

static void chat_with_leader(void)
{
/*	Rule 0:	Cheater checks.					*/
	if (u.uhave.questart && !Qstat(met_nemesis))
	    Qstat(cheater) = TRUE;

/*	It is possible for you to get the amulet without completing
 *	the quest.  If so, try to induce the player to quest.
 */
	if (Qstat(got_thanks)) {
/*	Rule 1:	You've gone back with/without the amulet.	*/
	    if (u.uhave.amulet)	finish_quest(NULL);

/*	Rule 2:	You've gone back before going for the amulet.	*/
	    else		qt_pager(QT_POSTHANKS);
	}

/*	Rule 3: You've got the artifact and are back to return it. */
	  else if (u.uhave.questart) {
	    struct obj *otmp;

	    for (otmp = invent; otmp; otmp = otmp->nobj)
		if (is_quest_artifact(otmp)) break;

	    finish_quest(otmp);

/*	Rule 4: You haven't got the artifact yet.	*/
	} else if (Qstat(got_quest) && !Qstat(pissed_off)) {
	    qt_pager(rn1(10, QT_ENCOURAGE));

/*	Rule 5: You aren't yet acceptable - or are you? */
	} else {
	  if (!Qstat(met_leader)) {
	    qt_pager(QT_FIRSTLEADER);
	    Qstat(met_leader) = TRUE;
	    Qstat(not_ready) = 0;
	  } else if (!Qstat(pissed_off)) {
	    qt_pager(QT_NEXTLEADER);
	  } else {
	    verbalize("Your bones shall serve to warn others.");
	  }
	  /* the quest leader might have passed through the portal into
	     the regular dungeon; none of the remaining make sense there */
	  if (!on_level(&u.uz, &qstart_level)) return;

	  if (not_capable()) {
	    qt_pager(QT_BADLEVEL);
	    exercise(A_WIS, TRUE);
	    expulsion(FALSE);
	  } else if (is_pure(TRUE) < 0) {
	    /* don't keep lecturing once the player's been kicked out once. */
	    if (!Qstat(pissed_off)) {
	      com_pager(QT_BANISHED);
	      Qstat(pissed_off) = 1;
	      expulsion(FALSE);
	    }
	  } else if (is_pure(TRUE) == 0) {
	    /* Don't end the game for too many tries anymore, that's silly */
	    qt_pager(QT_BADALIGN);
	    Qstat(not_ready) = 1;
	    exercise(A_WIS, TRUE);
	    expulsion(FALSE);
	  } else {	/* You are worthy! */
	    qt_pager(QT_ASSIGNQUEST);
	    exercise(A_WIS, TRUE);
	    Qstat(got_quest) = TRUE;
	    historic_event(FALSE, "embarked upon an epic quest.");
	  }
	}
}